

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall libcellml::Units::addUnit(Units *this,StandardUnit standardUnit)

{
  mapped_type *reference;
  StandardUnit local_64;
  string local_60;
  string local_40;
  
  local_64 = standardUnit;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&local_64);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"0","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  addUnit(this,reference,&local_40,1.0,1.0,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit)
{
    addUnit(standardUnitToString.at(standardUnit), "0", 1.0, 1.0, "");
}